

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void upb::generator::WriteMiniTableSourceIncludes
               (FileDefPtr file,MiniTableOptions *options,Output *output)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  generator *this;
  upb_FileDef *puVar4;
  compiler *this_00;
  undefined1 uVar5;
  char *in_RCX;
  string *__return_storage_ptr__;
  FileDefPtr file_00;
  char *extraout_RDX;
  FileDefPtr file_01;
  int i;
  int i_00;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view filename_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string local_50;
  
  pcVar3 = upb_FileDef_Name(file.ptr_);
  this = (generator *)strlen(pcVar3);
  filename._M_str = in_RCX;
  filename._M_len = (size_t)pcVar3;
  FileWarning_abi_cxx11_(&local_50,this,filename);
  uVar5 = SUB81(in_RCX,0);
  format._M_str = local_50._M_dataplus._M_p;
  format._M_len = local_50._M_string_length;
  Output::operator()<>(output,format);
  std::__cxx11::string::~string((string *)&local_50);
  file_00.ptr_._1_7_ = 0;
  file_00.ptr_._0_1_ = options->bootstrap;
  __return_storage_ptr__ = &local_50;
  (anonymous_namespace)::HeaderFilename_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)file.ptr_,file_00,(bool)uVar5);
  format_00._M_str =
       "#include <stddef.h>\n#include \"upb/generated_code_support.h\"\n#include \"$0\"\n";
  format_00._M_len = 0x4a;
  Output::operator()(output,format_00,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  i_00 = 0;
  do {
    iVar2 = upb_FileDef_DependencyCount(file.ptr_);
    uVar5 = SUB81(__return_storage_ptr__,0);
    if (iVar2 <= i_00) {
      format_02._M_str = "\n// Must be last.\n#include \"upb/port/def.inc\"\n\n";
      format_02._M_len = 0x2f;
      Output::operator()<>(output,format_02);
      format_03._M_str =
           "extern const struct upb_MiniTable UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n";
      format_03._M_len = 0x55;
      Output::operator()<>(output,format_03);
      return;
    }
    if (options->strip_nonfunctional_codegen == true) {
      puVar4 = upb_FileDef_Dependency(file.ptr_,i_00);
      pcVar3 = upb_FileDef_Name(puVar4);
      this_00 = (compiler *)strlen(pcVar3);
      filename_00._M_str = extraout_RDX;
      filename_00._M_len = (size_t)pcVar3;
      bVar1 = google::protobuf::compiler::IsKnownFeatureProto(this_00,filename_00);
      uVar5 = SUB81(__return_storage_ptr__,0);
      if (!bVar1) goto LAB_0010efef;
    }
    else {
LAB_0010efef:
      puVar4 = upb_FileDef_Dependency(file.ptr_,i_00);
      file_01.ptr_._1_7_ = 0;
      file_01.ptr_._0_1_ = options->bootstrap;
      (anonymous_namespace)::HeaderFilename_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)puVar4,file_01,(bool)uVar5);
      format_01._M_str = "#include \"$0\"\n";
      format_01._M_len = 0xe;
      __return_storage_ptr__ = &local_50;
      Output::operator()(output,format_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void WriteMiniTableSourceIncludes(upb::FileDefPtr file,
                                  const MiniTableOptions& options,
                                  Output& output) {
  output(FileWarning(file.name()));

  output(
      "#include <stddef.h>\n"
      "#include \"upb/generated_code_support.h\"\n"
      "#include \"$0\"\n",
      HeaderFilename(file, options.bootstrap));

  for (int i = 0; i < file.dependency_count(); i++) {
    if (options.strip_nonfunctional_codegen &&
        google::protobuf::compiler::IsKnownFeatureProto(file.dependency(i).name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    output("#include \"$0\"\n",
           HeaderFilename(file.dependency(i), options.bootstrap));
  }

  output(
      "\n"
      "// Must be last.\n"
      "#include \"upb/port/def.inc\"\n"
      "\n");

  output(
      "extern const struct upb_MiniTable "
      "UPB_PRIVATE(_kUpb_MiniTable_StaticallyTreeShaken);\n");
}